

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.h
# Opt level: O0

QByteArray * __thiscall QCborStreamReader::readAllUtf8String(QCborStreamReader *this)

{
  long lVar1;
  bool bVar2;
  QCborStreamReader *in_RDI;
  long in_FS_OFFSET;
  QByteArray *dst;
  QByteArray *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)&in_RDI->type_ = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->value64 = (quint64)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d)._M_t.
  super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>.
  _M_t.
  super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
  .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl =
       (QCborStreamReaderPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x4502c9);
  bVar2 = readAndAppendToUtf8String(in_RDI,in_stack_ffffffffffffff98);
  if (!bVar2) {
    QByteArray::QByteArray((QByteArray *)0x4502f2);
    QByteArray::operator=((QByteArray *)in_RDI,in_stack_ffffffffffffff98);
    QByteArray::~QByteArray((QByteArray *)0x45030b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray readAllUtf8String()
    {
        QByteArray dst;
        if (!readAndAppendToUtf8String(dst))
            dst = QByteArray{};
        return dst;
    }